

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

MDOperand * __thiscall
LLVMBC::ModuleParseContext::get_metadata(ModuleParseContext *this,uint64_t index)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  MDOperand *pMVar3;
  __hash_code __code;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  uVar1 = (this->metadata)._M_h._M_bucket_count;
  uVar4 = index % uVar1;
  p_Var5 = (this->metadata)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, p_Var5->_M_nxt[1]._M_nxt != (_Hash_node_base *)index
     )) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var2[1]._M_nxt == (_Hash_node_base *)index)) goto LAB_001849b9;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_001849b9:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var6->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    pMVar3 = LLVMContext::construct<LLVMBC::MDOperand,LLVMBC::Module*const&>
                       (this->context,&this->module);
    return pMVar3;
  }
  return (MDOperand *)p_Var2[2]._M_nxt;
}

Assistant:

MDOperand *ModuleParseContext::get_metadata(uint64_t index) const
{
	auto itr = metadata.find(index);
	if (itr != metadata.end())
		return itr->second;
	else
	{
		// Need to return a null-node like this since MDOperand is used as a reference in the LLVM API for some reason.
		return context->construct<MDOperand>(module);
	}
}